

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
hashString(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  byte *input;
  XXH64_hash_t XVar1;
  size_t len;
  
  input = *(byte **)this;
  if ((ulong)*input == 0xbf) {
    len = *(long *)(input + 1) + 9;
  }
  else {
    len = (ulong)*input - 0x3f;
  }
  XVar1 = VELOCYPACK_XXH64(input,len,seed);
  return XVar1;
}

Assistant:

inline uint64_t hashString(uint64_t seed = defaultSeed64) const noexcept {
    return VELOCYPACK_HASH(start(),
                           static_cast<std::size_t>(stringSliceLength()), seed);
  }